

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrQMDP.cpp
# Opt level: O2

void __thiscall
FactoredQLastTimeStepOrQMDP::FactoredQLastTimeStepOrQMDP
          (FactoredQLastTimeStepOrQMDP *this,
          shared_ptr<const_PlanningUnitFactoredDecPOMDPDiscrete> *puf)

{
  int *piVar1;
  sp_counted_base *psVar2;
  QMDP *this_00;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> local_38;
  
  (this->super_FactoredQLastTimeStepOrElse).super_FactoredQFunctionStateJAOHInterface.
  super_QFunctionJAOHInterface =
       (QFunctionJAOHInterface)&PTR__QFunctionForDecPOMDPInterface_005d9ff0;
  QFunctionForFactoredDecPOMDPInterface::QFunctionForFactoredDecPOMDPInterface
            ((QFunctionForFactoredDecPOMDPInterface *)
             &(this->super_FactoredQLastTimeStepOrElse).super_QFunctionForFactoredDecPOMDP,
             &PTR_construction_vtable_152__005d98f8);
  FactoredQLastTimeStepOrElse::FactoredQLastTimeStepOrElse
            (&this->super_FactoredQLastTimeStepOrElse,&PTR_construction_vtable_136__005d9850,puf);
  (this->super_FactoredQLastTimeStepOrElse).super_FactoredQFunctionStateJAOHInterface.
  super_QFunctionJAOHInterface = (QFunctionJAOHInterface)0x5d9680;
  *(undefined8 *)&(this->super_FactoredQLastTimeStepOrElse).super_QFunctionForFactoredDecPOMDP =
       0x5d97c8;
  this_00 = (QMDP *)operator_new(0x70);
  local_38.px = &puf->px->super_PlanningUnitDecPOMDPDiscrete;
  local_38.pn.pi_ = (puf->pn).pi_;
  psVar2 = (puf->pn).pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  QMDP::QMDP(this_00,&local_38,false);
  this->_m_QMDP = this_00;
  boost::detail::shared_count::~shared_count(&local_38.pn);
  return;
}

Assistant:

FactoredQLastTimeStepOrQMDP::
FactoredQLastTimeStepOrQMDP(const boost::shared_ptr<const PlanningUnitFactoredDecPOMDPDiscrete> &puf) :
    FactoredQLastTimeStepOrElse(puf)
{
    _m_QMDP=new QMDP( puf );
}